

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::IndexFinder::find(IndexFinder *this,int begMolIndex,int endMolIndex)

{
  int in_ECX;
  int in_EDX;
  SelectionSet *in_RSI;
  SelectionSet *in_RDI;
  int i;
  SelectionSet *ss;
  vector<int,_std::allocator<int>_> *this_00;
  int local_48;
  vector<int,_std::allocator<int>_> local_38;
  undefined1 local_19;
  SelectionSet *this_01;
  
  local_19 = 0;
  this_00 = &local_38;
  this_01 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,in_ECX));
  SelectionSet::SelectionSet(this_01,(vector<int,_std::allocator<int>_> *)CONCAT44(in_EDX,in_ECX));
  local_48 = in_EDX;
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  for (; local_48 < in_ECX; local_48 = local_48 + 1) {
    std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::operator[]
              ((vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *)
               &(((_Vector_base<int,_std::allocator<int>_> *)&in_RSI->bitsets_)->_M_impl).
                super__Vector_impl_data._M_finish,(long)local_48);
    SelectionSet::operator|=(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

SelectionSet IndexFinder::find(int begMolIndex, int endMolIndex) {
    SelectionSet ss(nObjects_);

#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (int i = begMolIndex; i < endMolIndex; ++i) {
#ifdef IS_MPI
      proc = info_->getMolToProc(i);

      if (proc == worldRank) {
#endif
        ss |= selectionSets_[i];
#ifdef IS_MPI
      }
#endif
    }
    return ss;
  }